

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O2

uint32_t basisu::set_block_bits(uint8_t *pBytes,uint64_t val,uint32_t num_bits,uint32_t cur_ofs)

{
  uint32_t uVar1;
  ulong uVar2;
  sbyte sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if (0x40 < num_bits) {
    __assert_fail("num_bits <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                  ,0xe9f,"uint32_t basisu::set_block_bits(uint8_t *, uint64_t, uint32_t, uint32_t)")
    ;
  }
  uVar2 = (ulong)cur_ofs;
  uVar5 = 1L << ((byte)num_bits & 0x3f);
  if (uVar5 <= val && num_bits != 0x40) {
    __assert_fail("(num_bits == 64) || (val < (1ULL << num_bits))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                  ,0xea0,"uint32_t basisu::set_block_bits(uint8_t *, uint64_t, uint32_t, uint32_t)")
    ;
  }
  uVar6 = 0xffffffffffffffff;
  if (num_bits != 0x40) {
    uVar6 = uVar5 - 1;
  }
  for (; uVar1 = (uint32_t)uVar2, num_bits != 0; num_bits = num_bits - uVar4) {
    uVar4 = 8 - (uVar1 & 7);
    if (num_bits <= uVar4) {
      uVar4 = num_bits;
    }
    sVar3 = (sbyte)(uVar1 & 7);
    lVar7 = val << sVar3;
    val = val >> ((byte)uVar4 & 0x3f);
    pBytes[uVar2 >> 3] = (byte)lVar7 | ~(byte)(uVar6 << sVar3) & pBytes[uVar2 >> 3];
    uVar2 = (ulong)(uVar1 + uVar4);
    uVar6 = uVar6 >> ((byte)uVar4 & 0x3f);
  }
  return uVar1;
}

Assistant:

static inline uint32_t set_block_bits(uint8_t* pBytes, uint64_t val, uint32_t num_bits, uint32_t cur_ofs)
	{
		assert(num_bits <= 64);
		assert((num_bits == 64) || (val < (1ULL << num_bits)));
		uint64_t mask = (num_bits == 64) ? UINT64_MAX : ((1ULL << num_bits) - 1);
		while (num_bits)
		{
			const uint32_t n = basisu::minimum<uint32_t>(8U - (cur_ofs & 7U), num_bits);
			pBytes[cur_ofs >> 3] &= ~static_cast<uint8_t>(mask << (cur_ofs & 7U));
			pBytes[cur_ofs >> 3] |= static_cast<uint8_t>(val << (cur_ofs & 7U));
			val >>= n;
			mask >>= n;
			num_bits -= n;
			cur_ofs += n;
		}
		return cur_ofs;
	}